

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::BindingSamplerSingleTest::prepareUniforms
          (BindingSamplerSingleTest *this,program *program)

{
  int iVar1;
  deUint32 err;
  size_type sVar2;
  reference pvVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  socklen_t __len;
  sockaddr *__addr;
  Functions *gl;
  GLuint i;
  undefined1 local_30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> texture_data;
  program *program_local;
  BindingSamplerSingleTest *this_local;
  
  texture_data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &program->m_compute_shader_id;
  Utils::texture::create(&this->m_goku_texture,0x10,0x10,0x8058);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,0x100);
  gl._0_4_ = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
    if (sVar2 <= (uint)gl) break;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,
                        (ulong)(uint)gl);
    *pvVar3 = 0xff;
    gl._0_4_ = (uint)gl + 1;
  }
  pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,0);
  Utils::texture::update(&this->m_goku_texture,0x10,0x10,0,0x1908,0x1401,pvVar3);
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_GLSLTestBase).super_TestBase.super_TestCase.m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 8))(0x84c2);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  iVar1 = 0x2a6c621;
  __len = 0x2913;
  glu::checkError(err,"ActiveTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x2913);
  Utils::texture::bind(&this->m_goku_texture,iVar1,__addr,__len);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  return;
}

Assistant:

void BindingSamplerSingleTest::prepareUniforms(Utils::program& program)
{
	(void)program;
	static const GLuint goku_data = 0x000000ff;

	m_goku_texture.create(16, 16, GL_RGBA8);

	std::vector<GLuint> texture_data;
	texture_data.resize(16 * 16);

	for (GLuint i = 0; i < texture_data.size(); ++i)
	{
		texture_data[i] = goku_data;
	}

	m_goku_texture.update(16, 16, 0 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, &texture_data[0]);

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.activeTexture(GL_TEXTURE2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ActiveTexture");

	m_goku_texture.bind();
}